

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_end_compress
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2d56,"OPJ_BOOL opj_j2k_setup_end_compress(opj_j2k_t *, opj_event_mgr_t *)");
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2d57,"OPJ_BOOL opj_j2k_setup_end_compress(opj_j2k_t *, opj_event_mgr_t *)");
  }
  OVar1 = opj_procedure_list_add_procedure(p_j2k->m_procedure_list,opj_j2k_write_eoc,p_manager);
  if (OVar1 != 0) {
    if (((ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U) < 4) &&
       (OVar1 = opj_procedure_list_add_procedure
                          (p_j2k->m_procedure_list,opj_j2k_write_updated_tlm,p_manager), OVar1 == 0)
       ) {
      return 0;
    }
    OVar1 = opj_procedure_list_add_procedure(p_j2k->m_procedure_list,opj_j2k_write_epc,p_manager);
    if (((OVar1 != 0) &&
        (OVar1 = opj_procedure_list_add_procedure
                           (p_j2k->m_procedure_list,opj_j2k_end_encoding,p_manager), OVar1 != 0)) &&
       (OVar1 = opj_procedure_list_add_procedure
                          (p_j2k->m_procedure_list,opj_j2k_destroy_header_memory,p_manager),
       OVar1 != 0)) {
      OVar1 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      return OVar1;
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_setup_end_compress(opj_j2k_t *p_j2k,
        opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);

    /* DEVELOPER CORNER, insert your custom procedures */
    if (! opj_procedure_list_add_procedure(p_j2k->m_procedure_list,
                                           (opj_procedure)opj_j2k_write_eoc, p_manager)) {
        return OPJ_FALSE;
    }

    if (OPJ_IS_CINEMA(p_j2k->m_cp.rsiz)) {
        if (! opj_procedure_list_add_procedure(p_j2k->m_procedure_list,
                                               (opj_procedure)opj_j2k_write_updated_tlm, p_manager)) {
            return OPJ_FALSE;
        }
    }

    if (! opj_procedure_list_add_procedure(p_j2k->m_procedure_list,
                                           (opj_procedure)opj_j2k_write_epc, p_manager)) {
        return OPJ_FALSE;
    }
    if (! opj_procedure_list_add_procedure(p_j2k->m_procedure_list,
                                           (opj_procedure)opj_j2k_end_encoding, p_manager)) {
        return OPJ_FALSE;
    }
    if (! opj_procedure_list_add_procedure(p_j2k->m_procedure_list,
                                           (opj_procedure)opj_j2k_destroy_header_memory, p_manager)) {
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}